

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRC.hpp
# Opt level: O2

uint16_t __thiscall Storage::Tape::Acorn::Parser::get_crc(Parser *this)

{
  return (this->crc_).value_;
}

Assistant:

inline IntType get_value() const {
			IntType result = value_ ^ output_xor;
			if constexpr (reflect_output) {
				IntType reflected_output = 0;
				for(std::size_t c = 0; c < sizeof(IntType); ++c) {
					reflected_output = IntType(reflected_output << 8) | IntType(reverse_byte(result & 0xff));
					result >>= 8;
				}
				return reflected_output;
			}
			return result;
		}